

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

int __thiscall Popup::init(Popup *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  PopupTransition PVar3;
  
  uVar1 = this->height;
  uVar2 = this->width;
  this->x = uVar2;
  this->y = uVar1;
  PVar3 = this->transition;
  if (PVar3 - TRANSITION_SLIDEINBOTTOM < 2) {
    this->x = 0;
    return PVar3;
  }
  if (PVar3 == TRANSITION_FADE) {
    this->alpha = 0.0;
    this->x = 0;
    this->y = 0;
  }
  return PVar3;
}

Assistant:

void Popup::init()
{
	x = width;
	y = height;
	switch(transition)
	{
		case TRANSITION_SLIDEINBOTTOM:
		case TRANSITION_PUSHUP:
			x = 0;
			break;
		case TRANSITION_FADE:
			alpha = 0;
			x = 0;
			y = 0;
			break;
		default:
			break;
	}
}